

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2_mac_impl.c
# Opt level: O0

int blake2_get_ctx_params(void *vmacctx,OSSL_PARAM *params)

{
  int iVar1;
  OSSL_PARAM *pOVar2;
  void *in_RDI;
  OSSL_PARAM *p;
  OSSL_PARAM *in_stack_ffffffffffffffd8;
  OSSL_PARAM *p_00;
  
  pOVar2 = OSSL_PARAM_locate(in_stack_ffffffffffffffd8,(char *)0x33a9cf);
  if (pOVar2 != (OSSL_PARAM *)0x0) {
    p_00 = pOVar2;
    blake2_mac_size(in_RDI);
    iVar1 = OSSL_PARAM_set_size_t(p_00,(size_t)pOVar2);
    in_stack_ffffffffffffffd8 = pOVar2;
    if (iVar1 == 0) {
      return 0;
    }
  }
  pOVar2 = OSSL_PARAM_locate(in_stack_ffffffffffffffd8,(char *)0x33aa19);
  if ((pOVar2 != (OSSL_PARAM *)0x0) &&
     (iVar1 = OSSL_PARAM_set_size_t(pOVar2,(size_t)in_stack_ffffffffffffffd8), iVar1 == 0)) {
    return 0;
  }
  return 1;
}

Assistant:

static int blake2_get_ctx_params(void *vmacctx, OSSL_PARAM params[])
{
    OSSL_PARAM *p;

    if ((p = OSSL_PARAM_locate(params, OSSL_MAC_PARAM_SIZE)) != NULL
            && !OSSL_PARAM_set_size_t(p, blake2_mac_size(vmacctx)))
        return 0;

    if ((p = OSSL_PARAM_locate(params, OSSL_MAC_PARAM_BLOCK_SIZE)) != NULL
            && !OSSL_PARAM_set_size_t(p, BLAKE2_BLOCKBYTES))
        return 0;

    return 1;
}